

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O1

FT_UInt cff_get_name_index(CFF_Face face,FT_String *glyph_name)

{
  void *pvVar1;
  FT_Driver module;
  FT_UInt FVar2;
  int iVar3;
  FT_Module module_00;
  FT_Pointer pvVar4;
  char *__s2;
  uint uVar5;
  ulong uVar6;
  
  pvVar1 = (face->extra).data;
  module = (face->root).driver;
  if (*(char *)((long)pvVar1 + 0x28) == '\x02') {
    module_00 = FT_Get_Module((module->root).library,"sfnt");
    pvVar4 = ft_module_get_service(module_00,"glyph-dict",'\0');
    uVar6 = 0;
    if ((pvVar4 != (FT_Pointer)0x0) && (*(code **)((long)pvVar4 + 8) != (code *)0x0)) {
      FVar2 = (**(code **)((long)pvVar4 + 8))(face,glyph_name);
      return FVar2;
    }
  }
  else {
    pvVar4 = ft_module_get_service(&module->root,"postscript-cmaps",'\x01');
    uVar6 = 0;
    if ((pvVar4 != (FT_Pointer)0x0) && (uVar6 = 0, *(int *)((long)pvVar1 + 0x24) != 0)) {
      uVar6 = 0;
      do {
        uVar5 = (uint)*(ushort *)(*(long *)((long)pvVar1 + 0x520) + uVar6 * 2);
        if (uVar5 < 0x187) {
          __s2 = (char *)(**(code **)((long)pvVar4 + 0x28))();
        }
        else {
          uVar5 = uVar5 - 0x187;
          if (uVar5 < *(uint *)((long)pvVar1 + 0x648)) {
            __s2 = *(char **)(*(long *)((long)pvVar1 + 0x650) + (ulong)uVar5 * 8);
          }
          else {
            __s2 = (char *)0x0;
          }
        }
        if (__s2 != (char *)0x0) {
          iVar3 = strcmp(glyph_name,__s2);
          if (iVar3 == 0) goto LAB_002257a2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)((long)pvVar1 + 0x24));
      uVar6 = 0;
    }
  }
LAB_002257a2:
  return (FT_UInt)uVar6;
}

Assistant:

static FT_UInt
  cff_get_name_index( CFF_Face          face,
                      const FT_String*  glyph_name )
  {
    CFF_Font            cff;
    CFF_Charset         charset;
    FT_Service_PsCMaps  psnames;
    FT_String*          name;
    FT_UShort           sid;
    FT_UInt             i;


    cff     = (CFF_FontRec *)face->extra.data;
    charset = &cff->charset;

    /* CFF2 table does not have glyph names; */
    /* we need to use `post' table method    */
    if ( cff->version_major == 2 )
    {
      FT_Library            library     = FT_FACE_LIBRARY( face );
      FT_Module             sfnt_module = FT_Get_Module( library, "sfnt" );
      FT_Service_GlyphDict  service     =
        (FT_Service_GlyphDict)ft_module_get_service(
                                 sfnt_module,
                                 FT_SERVICE_ID_GLYPH_DICT,
                                 0 );


      if ( service && service->name_index )
        return service->name_index( FT_FACE( face ), glyph_name );
      else
      {
        FT_ERROR(( "cff_get_name_index:"
                   " cannot get glyph index from a CFF2 font\n" ));
        FT_ERROR(( "                   "
                   " without the `psnames' module\n" ));
        return 0;
      }
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    if ( !psnames )
      return 0;

    for ( i = 0; i < cff->num_glyphs; i++ )
    {
      sid = charset->sids[i];

      if ( sid > 390 )
        name = cff_index_get_string( cff, sid - 391 );
      else
        name = (FT_String *)psnames->adobe_std_strings( sid );

      if ( !name )
        continue;

      if ( !ft_strcmp( glyph_name, name ) )
        return i;
    }

    return 0;
  }